

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  pointer pbVar4;
  long *msg;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  ostringstream cmCPackLog_msg_1;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  undefined1 local_4c8 [16];
  _func_int *local_4b8 [12];
  ios_base local_458 [264];
  undefined1 local_350 [64];
  _Alloc_hider local_310;
  size_type local_308;
  undefined1 local_270 [112];
  ios_base local_200 [472];
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_cmCPackGenerator).packageFileNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pcVar2 = local_270 + 0x10;
  local_270._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"CPACK_ARCHIVE_FILE_NAME","");
  bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_270);
  if ((pointer)local_270._0_8_ != pcVar2) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if (bVar6) {
    local_270._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"CPACK_ARCHIVE_FILE_NAME","");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_270);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_270._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"CPACK_PACKAGE_FILE_NAME","");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_270);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_270._0_8_ != pcVar2) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_270,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
             ,0x59);
  std::ios::widen((char)(ostringstream *)local_270 + (char)*(undefined8 *)(local_270._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_270);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar5 = local_4c8._0_8_;
  sVar8 = strlen((char *)local_4c8._0_8_);
  cmCPackLog::Log(pcVar3,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xda,(char *)uVar5,sVar8);
  if ((_func_int **)local_4c8._0_8_ != local_4b8) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
  std::ios_base::~ios_base(local_200);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_270,None);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_270,
             (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,false,true);
  iVar7 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_270);
  if (iVar7 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"Problem to generate Header for archive <",0x28);
    pbVar4 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4c8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,">.",2);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar5 = local_350._0_8_;
    sVar8 = strlen((char *)local_350._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xdb,(char *)uVar5,sVar8);
    if ((ostream *)local_350._0_8_ != (ostream *)(local_350 + 0x10)) {
      operator_delete((void *)local_350._0_8_,(ulong)((long)(uint *)local_350._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
    std::ios_base::~ios_base(local_458);
    iVar7 = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_350,(ostream *)local_270,this->Compress,&this->ArchiveFormat)
    ;
    if (local_308 == 0) {
      p_Var10 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      iVar7 = 1;
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        do {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_350,(cmCPackComponent *)(p_Var10 + 2));
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c8,"Problem to create archive <",0x1b);
      pbVar4 = (this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,">, ERROR = ",0xb);
      local_4e8 = local_4d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,local_310._M_p,local_310._M_p + local_308);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_4e8,local_4e0);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg = local_4e8;
      sVar8 = strlen((char *)local_4e8);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xdb,(char *)msg,sVar8);
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
      std::ios_base::~ios_base(local_458);
      iVar7 = 0;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_350);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return iVar7;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.emplace_back(toplevel);
  packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileNames[0] += this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    packageFileNames[0] += this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  // The ALL COMPONENTS in ONE package case
  for (auto& comp : this->Components) {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive, &(comp.second));
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}